

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector_p.h
# Opt level: O2

void __thiscall QFileSelectorPrivate::~QFileSelectorPrivate(QFileSelectorPrivate *this)

{
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QFileSelectorPrivate_00661220;
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->extras).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

class Q_CORE_EXPORT QFileSelectorPrivate : QObjectPrivate //Exported for use in other modules (like QtGui)
{
    Q_DECLARE_PUBLIC(QFileSelector)
public:
    static void updateSelectors();
    static QStringList platformSelectors();
    static void addStatics(const QStringList &); //For loading GUI statics from other Qt modules
    static QString selectionHelper(const QString &path, const QString &fileName,
                                   const QStringList &selectors, QChar indicator = u'+');
    QFileSelectorPrivate();
    QString select(const QString &filePath) const;

    QStringList extras;
}